

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

string * __thiscall
Catch::Matchers::StdString::CasedString::caseSensitivitySuffix_abi_cxx11_
          (string *__return_storage_ptr__,CasedString *this)

{
  Choice CVar1;
  
  CVar1 = this->m_caseSensitivity;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (CVar1 == No) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__," (case insensitive)","");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CasedString::caseSensitivitySuffix() const {
            return m_caseSensitivity == CaseSensitive::No
                   ? " (case insensitive)"
                   : std::string();
        }